

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# quant_enc.c
# Opt level: O3

int ReconstructUV(VP8EncIterator *it,VP8ModeScore *rd,uint8_t *yuv_out,int mode)

{
  uint8_t *puVar1;
  DError *paaiVar2;
  int iVar3;
  int iVar4;
  int iVar5;
  VP8Matrix *pVVar6;
  undefined8 uVar7;
  uint16_t *puVar8;
  int16_t *piVar9;
  uint uVar11;
  ulong uVar12;
  int16_t *piVar13;
  uint8_t *puVar14;
  long lVar15;
  int16_t (*paiVar16) [16];
  int16_t tmp [8] [16];
  int16_t local_178 [4];
  VP8EncIterator *local_170;
  VP8Matrix *local_168;
  VP8Encoder *local_160;
  VP8SegmentInfo *local_158;
  uint8_t *local_150;
  uint8_t *local_148;
  int8_t (*local_140) [3];
  int16_t local_138 [132];
  int16_t *piVar10;
  
  piVar9 = local_178;
  piVar10 = local_178;
  puVar1 = it->yuv_in_;
  local_160 = it->enc_;
  puVar14 = it->yuv_p_ + VP8UVModeOffsets[mode];
  local_168 = (VP8Matrix *)(ulong)(*(byte *)it->mb_ >> 5 & 3);
  uVar12 = 0xfffffffffffffffe;
  piVar13 = local_138;
  puVar8 = VP8ScanUV;
  local_170 = it;
  local_148 = yuv_out;
  do {
    (*VP8FTransform2)(puVar1 + (ulong)*puVar8 + 0x10,puVar14 + *puVar8,piVar13);
    uVar12 = uVar12 + 2;
    piVar13 = piVar13 + 0x20;
    puVar8 = puVar8 + 2;
  } while (uVar12 < 6);
  local_158 = local_160->dqm_ + (long)local_168;
  local_150 = puVar14;
  if (local_170->top_derr_ != (DError *)0x0) {
    pVVar6 = &local_160->dqm_[(long)local_168].uv_;
    local_140 = rd->derr;
    uVar7 = CONCAT71((int7)((ulong)local_140 >> 8),1);
    lVar15 = 0;
    local_168 = pVVar6;
    do {
      local_160 = (VP8Encoder *)CONCAT44(local_160._4_4_,(int)uVar7);
      iVar4 = local_170->x_;
      paaiVar2 = local_170->top_derr_;
      piVar13 = local_138 + lVar15 * 0x40;
      *piVar13 = *piVar13 +
                 (short)((uint)(int)(short)(paaiVar2[iVar4][lVar15][0] * 7 +
                                           local_170->left_derr_[lVar15][0] * 8) >> 3);
      iVar3 = QuantizeSingle(piVar13,pVVar6);
      piVar13 = local_138 + lVar15 * 0x40 + 0x10;
      *piVar13 = *piVar13 + (short)((uint)(paaiVar2[iVar4][lVar15][1] * 7) >> 3) + (short)iVar3;
      iVar4 = QuantizeSingle(piVar13,pVVar6);
      piVar13 = local_138 + lVar15 * 0x40 + 0x20;
      *piVar13 = *piVar13 +
                 (short)((uint)(iVar3 * 7) >> 3) + (short)local_170->left_derr_[lVar15][1];
      iVar3 = QuantizeSingle(piVar13,pVVar6);
      piVar13 = local_138 + lVar15 * 0x40 + 0x30;
      *piVar13 = *piVar13 + (short)((uint)(iVar4 * 7) >> 3) + (short)iVar3;
      iVar5 = QuantizeSingle(piVar13,pVVar6);
      local_140[lVar15][0] = (int8_t)iVar4;
      local_140[lVar15][1] = (int8_t)iVar3;
      local_140[lVar15][2] = (int8_t)iVar5;
      lVar15 = 1;
      uVar7 = 0;
    } while (((ulong)local_160 & 1) != 0);
  }
  paiVar16 = rd->uv_levels;
  pVVar6 = &local_158->uv_;
  uVar11 = 0;
  uVar12 = 0xfffffffffffffffe;
  do {
    piVar9 = piVar9 + 0x20;
    iVar4 = (*VP8EncQuantize2Blocks)(piVar9,*paiVar16,pVVar6);
    puVar14 = local_148;
    puVar1 = local_150;
    uVar12 = uVar12 + 2;
    uVar11 = uVar11 | iVar4 << ((byte)uVar12 & 0x1f);
    paiVar16 = paiVar16 + 2;
  } while (uVar12 < 6);
  uVar12 = 0xfffffffffffffffe;
  puVar8 = VP8ScanUV;
  do {
    piVar10 = piVar10 + 0x20;
    (*VP8ITransform)(puVar1 + *puVar8,piVar10,puVar14 + *puVar8,1);
    uVar12 = uVar12 + 2;
    puVar8 = puVar8 + 2;
  } while (uVar12 < 6);
  return uVar11 << 0x10;
}

Assistant:

static int ReconstructUV(VP8EncIterator* const it, VP8ModeScore* const rd,
                         uint8_t* const yuv_out, int mode) {
  const VP8Encoder* const enc = it->enc_;
  const uint8_t* const ref = it->yuv_p_ + VP8UVModeOffsets[mode];
  const uint8_t* const src = it->yuv_in_ + U_OFF_ENC;
  const VP8SegmentInfo* const dqm = &enc->dqm_[it->mb_->segment_];
  int nz = 0;
  int n;
  int16_t tmp[8][16];

  for (n = 0; n < 8; n += 2) {
    VP8FTransform2(src + VP8ScanUV[n], ref + VP8ScanUV[n], tmp[n]);
  }
  if (it->top_derr_ != NULL) CorrectDCValues(it, &dqm->uv_, tmp, rd);

  if (DO_TRELLIS_UV && it->do_trellis_) {
    int ch, x, y;
    for (ch = 0, n = 0; ch <= 2; ch += 2) {
      for (y = 0; y < 2; ++y) {
        for (x = 0; x < 2; ++x, ++n) {
          const int ctx = it->top_nz_[4 + ch + x] + it->left_nz_[4 + ch + y];
          const int non_zero = TrellisQuantizeBlock(
              enc, tmp[n], rd->uv_levels[n], ctx, TYPE_CHROMA_A, &dqm->uv_,
              dqm->lambda_trellis_uv_);
          it->top_nz_[4 + ch + x] = it->left_nz_[4 + ch + y] = non_zero;
          nz |= non_zero << n;
        }
      }
    }
  } else {
    for (n = 0; n < 8; n += 2) {
      nz |= VP8EncQuantize2Blocks(tmp[n], rd->uv_levels[n], &dqm->uv_) << n;
    }
  }

  for (n = 0; n < 8; n += 2) {
    VP8ITransform(ref + VP8ScanUV[n], tmp[n], yuv_out + VP8ScanUV[n], 1);
  }
  return (nz << 16);
}